

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANSIFontWriter.cpp
# Opt level: O1

EStatusCode __thiscall
ANSIFontWriter::WriteFont
          (ANSIFontWriter *this,FreeTypeFaceWrapper *inFontInfo,
          WrittenFontRepresentation *inFontOccurrence,ObjectsContext *inObjectsContext,
          IANSIFontWriterHelper *inANSIFontWriterHelper,string *inSubsetFontName)

{
  EStatusCode EVar1;
  int iVar2;
  Trace *pTVar3;
  DictionaryContext *this_00;
  IndirectObjectsReferenceRegistry *pIVar4;
  ObjectIDType inObjectReference;
  ObjectIDType inObjectReference_00;
  undefined4 extraout_var;
  FontDescriptorWriter fontDescriptorWriter;
  FontDescriptorWriter local_41;
  FreeTypeFaceWrapper *local_40;
  string *local_38;
  
  local_40 = inFontInfo;
  FontDescriptorWriter::FontDescriptorWriter(&local_41);
  EVar1 = ObjectsContext::StartNewIndirectObject
                    (inObjectsContext,inFontOccurrence->mWrittenObjectID);
  if (EVar1 == eSuccess) {
    this->mFontInfo = local_40;
    this->mFontOccurrence = inFontOccurrence;
    this->mObjectsContext = inObjectsContext;
    this_00 = ObjectsContext::StartDictionary(inObjectsContext);
    DictionaryContext::WriteKey(this_00,&scType_abi_cxx11_);
    DictionaryContext::WriteNameValue(this_00,&scFont_abi_cxx11_);
    DictionaryContext::WriteKey(this_00,&scSubtype_abi_cxx11_);
    (*inANSIFontWriterHelper->_vptr_IANSIFontWriterHelper[2])(inANSIFontWriterHelper,this_00);
    DictionaryContext::WriteKey(this_00,&scBaseFont_abi_cxx11_);
    DictionaryContext::WriteNameValue(this_00,inSubsetFontName);
    CalculateCharacterEncodingArray(this);
    WriteWidths(this,this_00);
    iVar2 = (*inANSIFontWriterHelper->_vptr_IANSIFontWriterHelper[4])(inANSIFontWriterHelper);
    if ((char)iVar2 != '\0') {
      CalculateDifferences(this);
    }
    WriteEncoding(this,this_00);
    DictionaryContext::WriteKey(this_00,&scToUnicode_abi_cxx11_);
    local_38 = inSubsetFontName;
    pIVar4 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar4);
    DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference);
    DictionaryContext::WriteKey(this_00,&scFontDescriptor_abi_cxx11_);
    pIVar4 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    inObjectReference_00 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar4);
    DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference_00);
    EVar1 = ObjectsContext::EndDictionary(inObjectsContext,this_00);
    if (EVar1 == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
      if ((this->mDifferences).
          super__List_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl._M_node._M_size != 0) {
        EVar1 = WriteEncodingDictionary(this);
        if (EVar1 != eSuccess) {
          pTVar3 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar3,"ANSIFontWriter::WriteFont, failed to write encoding dictionary")
          ;
          goto LAB_002136c3;
        }
      }
      WriteToUnicodeMap(this,inObjectReference);
      iVar2 = (*inANSIFontWriterHelper->_vptr_IANSIFontWriterHelper[3])(inANSIFontWriterHelper);
      EVar1 = FontDescriptorWriter::WriteFontDescriptor
                        (&local_41,inObjectReference_00,local_38,local_40,&this->mCharactersVector,
                         inObjectsContext,(IFontDescriptorHelper *)CONCAT44(extraout_var,iVar2));
    }
    else {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "ANSIFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
    }
  }
  else {
    pTVar3 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar3,
                      "ANSIFontWriter::WriteFont, Failed to start indirect object for written font %ld"
                      ,inFontOccurrence->mWrittenObjectID);
  }
LAB_002136c3:
  FontDescriptorWriter::~FontDescriptorWriter(&local_41);
  return EVar1;
}

Assistant:

EStatusCode ANSIFontWriter::WriteFont(	FreeTypeFaceWrapper& inFontInfo,
											WrittenFontRepresentation* inFontOccurrence,
											ObjectsContext* inObjectsContext,
											IANSIFontWriterHelper* inANSIFontWriterHelper,
											const std::string& inSubsetFontName)
{
	EStatusCode status = PDFHummus::eSuccess;
	FontDescriptorWriter fontDescriptorWriter;


	do
	{
		status = inObjectsContext->StartNewIndirectObject(inFontOccurrence->mWrittenObjectID);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG1("ANSIFontWriter::WriteFont, Failed to start indirect object for written font %ld", inFontOccurrence->mWrittenObjectID);
			break;
		}
		
		mFontInfo = &inFontInfo;
		mFontOccurrence = inFontOccurrence;
		mObjectsContext = inObjectsContext;

		DictionaryContext* fontContext = inObjectsContext->StartDictionary();

		// Type
		fontContext->WriteKey(scType);
		fontContext->WriteNameValue(scFont);

		// SubType
		fontContext->WriteKey(scSubtype);
		inANSIFontWriterHelper->WriteSubTypeValue(fontContext); // using the font particular type

		// BaseFont
		fontContext->WriteKey(scBaseFont);
		fontContext->WriteNameValue(inSubsetFontName);


		/*
			as for widths.
			i have to create a list/array of the characters ordered from lowest encoded value to highest, and fill it up with the charachters mapped
			to glyphs. this will allow me to later write the highest and lowest char codes, as well as loop the list and 
			write the widths.
		*/
		CalculateCharacterEncodingArray();

		WriteWidths(fontContext);

		if(inANSIFontWriterHelper->CanWriteDifferencesFromWinAnsi())
			CalculateDifferences();
		WriteEncoding(fontContext);

		// ToUnicode
		fontContext->WriteKey(scToUnicode);
		ObjectIDType toUnicodeMapObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
		fontContext->WriteNewObjectReferenceValue(toUnicodeMapObjectID);


		// FontDescriptor
		fontContext->WriteKey(scFontDescriptor);
		ObjectIDType fontDescriptorObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
		fontContext->WriteNewObjectReferenceValue(fontDescriptorObjectID);

		status = inObjectsContext->EndDictionary(fontContext);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("ANSIFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
			break;
		}

		inObjectsContext->EndIndirectObject();	

		// if necessary, write a dictionary encoding
		if(mDifferences.size() > 0) {
			status = WriteEncodingDictionary();
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("ANSIFontWriter::WriteFont, failed to write encoding dictionary");
				break;
			}
		}

		WriteToUnicodeMap(toUnicodeMapObjectID);
		status = fontDescriptorWriter.WriteFontDescriptor(fontDescriptorObjectID,
												inSubsetFontName,
												&inFontInfo,
												mCharactersVector,
												inObjectsContext,
												inANSIFontWriterHelper->GetCharsetWriter());
	}while(false);
	return status;
}